

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O0

Allocation __thiscall
density::
heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<65536ul>>
::inplace_allocate<1ul,true>
          (heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>>>,density_tests::DeepTestAllocator<65536ul>>
           *this,size_t i_size,size_t i_alignment)

{
  bool bVar1;
  void *pvVar2;
  void *pvVar3;
  Allocation AVar4;
  void *end_of_page;
  void *user_storage;
  void *new_tail;
  ControlBlock *control_block;
  size_t i_alignment_local;
  size_t i_size_local;
  heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
  *this_local;
  void *local_10;
  
  bVar1 = is_power_of_2(i_alignment);
  if ((!bVar1) || (i_size % i_alignment != 0)) {
    density_tests::detail::assert_failed<>
              ("is_power_of_2(i_alignment) && (i_size % i_alignment) == 0",anon_var_dwarf_12e55,
               0xa8c);
  }
  i_alignment_local = i_size;
  control_block = (ControlBlock *)i_alignment;
  if (i_alignment < 8) {
    control_block = (ControlBlock *)0x8;
    i_alignment_local = uint_upper_align<unsigned_long>(i_size,8);
  }
  while( true ) {
    bVar1 = address_is_aligned(*(void **)(this + 0x30),8);
    if ((!bVar1) && (*(long *)(this + 0x30) != 0xffef)) {
      density_tests::detail::assert_failed<>
                ("address_is_aligned(m_tail, min_alignment) || m_tail == reinterpret_cast<ControlBlock *>(s_invalid_control_block)"
                 ,anon_var_dwarf_12e55,0xa98);
    }
    this_local = *(heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
                   **)(this + 0x30);
    pvVar2 = address_add(this_local,0x10);
    local_10 = address_upper_align(pvVar2,(size_t)control_block);
    pvVar2 = address_add(local_10,i_alignment_local);
    pvVar3 = heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>_>
             ::get_end_of_page(this_local);
    if (pvVar2 <= pvVar3) break;
    if (0xffd8 < (long)&control_block[-1].m_next + i_alignment_local) {
      AVar4 = external_allocate<1ul>(this,i_alignment_local,(size_t)control_block);
      return AVar4;
    }
    heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>_>
    ::allocate_new_page((heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<65536UL>_>
                         *)this);
  }
  memset(this_local,0,8);
  ((ControlBlock *)this_local)->m_next = (long)pvVar2 + 1;
  *(void **)(this + 0x30) = pvVar2;
  return _this_local;
}

Assistant:

Allocation inplace_allocate(size_t i_size, size_t i_alignment)
        {
            DENSITY_ASSERT_INTERNAL(is_power_of_2(i_alignment) && (i_size % i_alignment) == 0);

            if (i_alignment < min_alignment)
            {
                i_alignment = min_alignment;
                i_size      = uint_upper_align(i_size, min_alignment);
            }

            for (;;)
            {
                DENSITY_ASSERT_INTERNAL(
                  address_is_aligned(m_tail, min_alignment) ||
                  m_tail == reinterpret_cast<ControlBlock *>(s_invalid_control_block));

                // allocate space for the control block and the runtime type
                auto const control_block = m_tail;
                void *     new_tail      = address_add(
                  control_block,
                  INCLUDE_TYPE ? (s_sizeof_ControlBlock + s_sizeof_RuntimeType)
                               : s_sizeof_ControlBlock);

                // allocate space for the element
                new_tail                  = address_upper_align(new_tail, i_alignment);
                void * const user_storage = new_tail;
                new_tail                  = address_add(new_tail, i_size);

                // check if a page overflow would occur
                void * end_of_page = get_end_of_page(control_block);
                if (DENSITY_LIKELY(new_tail <= end_of_page))
                {
                    DENSITY_ASSUME(control_block != nullptr);
                    new (control_block) ControlBlock();

                    control_block->m_next = reinterpret_cast<uintptr_t>(new_tail) + CONTROL_BITS;
                    m_tail                = static_cast<ControlBlock *>(new_tail);
                    return Allocation{control_block, user_storage};
                }
                else if (
                  i_size + (i_alignment - min_alignment) <=
                  s_max_size_inpage) // if this allocation may fit in a page
                {
                    // allocate a new page and redo
                    allocate_new_page();
                }
                else
                {
                    // this allocation would never fit in a page, allocate an external block
                    return external_allocate<CONTROL_BITS>(i_size, i_alignment);
                }
            }
        }